

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satMem.c
# Opt level: O0

void Sat_MmStepRestart(Sat_MmStep_t *p)

{
  int local_14;
  int i;
  Sat_MmStep_t *p_local;
  
  if (p->nChunksAlloc != 0) {
    for (local_14 = 0; local_14 < p->nChunks; local_14 = local_14 + 1) {
      if (p->pChunks[local_14] != (char *)0x0) {
        free(p->pChunks[local_14]);
        p->pChunks[local_14] = (char *)0x0;
      }
    }
    p->nChunks = 0;
  }
  for (local_14 = 0; local_14 < p->nMems; local_14 = local_14 + 1) {
    Sat_MmFixedRestart(p->pMems[local_14]);
  }
  return;
}

Assistant:

void Sat_MmStepRestart( Sat_MmStep_t * p )
{
    int i;
    if ( p->nChunksAlloc )
    {
        for ( i = 0; i < p->nChunks; i++ )
            ABC_FREE( p->pChunks[i] );
        p->nChunks = 0;
    }
    for ( i = 0; i < p->nMems; i++ )
        Sat_MmFixedRestart( p->pMems[i] );
}